

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  initializer_list<wasm::Literal> init;
  bool bVar1;
  BasicHeapType BVar2;
  Literal *local_130;
  HeapType local_100;
  shared_ptr<wasm::GCData> local_f8;
  HeapType local_e8;
  Literal *local_e0;
  Literal local_d8;
  iterator local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [60];
  undefined1 local_74 [20];
  HeapType local_60;
  HeapType heapType;
  HeapType local_48;
  shared_ptr<wasm::GCData> local_40;
  HeapType local_30;
  Type local_28;
  Type local_20;
  Literal *local_18;
  Literal *this_local;
  
  local_20.id = (this->type).id;
  local_18 = this;
  this_local = __return_storage_ptr__;
  HeapType::HeapType(&local_30,any);
  wasm::Type::Type(&local_28,local_30,Nullable);
  bVar1 = wasm::Type::isSubType(local_20,local_28);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapType::any, Nullable)) && \"can only externalize internal references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa25,"Literal wasm::Literal::externalize() const");
  }
  bVar1 = isNull(this);
  if (bVar1) {
    std::shared_ptr<wasm::GCData>::shared_ptr(&local_40);
    HeapType::HeapType(&local_48,noext);
    Literal(__return_storage_ptr__,&local_40,local_48);
    std::shared_ptr<wasm::GCData>::~shared_ptr(&local_40);
  }
  else {
    local_60 = wasm::Type::getHeapType(&this->type);
    bVar1 = HeapType::isBasic(&local_60);
    if (bVar1) {
      BVar2 = HeapType::getBasic(&local_60);
      if (BVar2 != i31) {
        if (3 < BVar2 - string) {
          handle_unreachable("unexpected type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                             ,0xa36);
        }
        handle_unreachable("TODO: string literals",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0xa34);
      }
      local_74._0_4_ = 4;
      local_e0 = &local_d8;
      Literal(local_e0,this);
      local_c0 = &local_d8;
      local_b8 = 1;
      init._M_len = 1;
      init._M_array = local_c0;
      Literals::Literals((Literals *)local_b0,init);
      std::make_shared<wasm::GCData,wasm::HeapType::BasicHeapType,wasm::Literals>
                ((BasicHeapType *)(local_74 + 4),(Literals *)local_74);
      HeapType::HeapType(&local_e8,ext);
      Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)(local_74 + 4),local_e8);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)(local_74 + 4));
      Literals::~Literals((Literals *)local_b0);
      local_130 = (Literal *)&local_c0;
      do {
        local_130 = local_130 + 0xffffffffffffffff;
        ~Literal(local_130);
      } while (local_130 != &local_d8);
    }
    else {
      std::shared_ptr<wasm::GCData>::shared_ptr(&local_f8,(shared_ptr<wasm::GCData> *)this);
      HeapType::HeapType(&local_100,ext);
      Literal(__return_storage_ptr__,&local_f8,local_100);
      std::shared_ptr<wasm::GCData>::~shared_ptr(&local_f8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::externalize() const {
  assert(Type::isSubType(type, Type(HeapType::any, Nullable)) &&
         "can only externalize internal references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::noext);
  }
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31: {
        return Literal(std::make_shared<GCData>(HeapType::i31, Literals{*this}),
                       HeapType::ext);
      }
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  return Literal(gcData, HeapType::ext);
}